

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

curl_socket_t connect_to(char *ipaddr,unsigned_short port)

{
  uint uVar1;
  socklen_t __len;
  int __fd;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  char *pcVar5;
  curl_socklen_t flag;
  char local_9c [8];
  ulong uStack_94;
  undefined8 local_8c;
  
  pcVar4 = "[";
  if (socket_domain != socket_domain_inet6) {
    pcVar4 = "";
  }
  pcVar5 = "]";
  if (socket_domain != socket_domain_inet6) {
    pcVar5 = "";
  }
  if (ipaddr == (char *)0x0) {
    return -1;
  }
  logmsg("about to connect to %s%s%s:%hu",pcVar4,ipaddr,pcVar5);
  __fd = socket(socket_domain,1,0);
  if (__fd == -1) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = strerror(uVar1);
    logmsg("Error creating socket for server connection: (%d) %s",(ulong)uVar1,pcVar4);
    return -1;
  }
  if ((socket_domain + DOCNUMBER_WERULEZ & 0xfffffff7U) == 0) {
    flag = 1;
    iVar2 = setsockopt(__fd,6,1,&flag,4);
    if (iVar2 != 0) {
      logmsg("====> TCP_NODELAY for server connection failed");
    }
  }
  if (socket_domain == FLAGS_SPACE) {
    logmsg("Proxying through Unix socket is not (yet?) supported.");
    return -1;
  }
  if (socket_domain == socket_domain_inet6) {
    local_9c[0] = '\0';
    local_9c[1] = '\0';
    local_9c[2] = '\0';
    local_9c[3] = '\0';
    local_9c[4] = '\0';
    local_9c[5] = '\0';
    local_9c[6] = '\0';
    local_9c[7] = '\0';
    uStack_94 = 0;
    local_8c = 0;
    flag = CONCAT22(port << 8 | port >> 8,10);
    iVar2 = inet_pton(10,ipaddr,local_9c + 4);
    if (iVar2 < 1) {
      pcVar4 = "Error inet_pton failed AF_INET6 conversion of \'%s\'";
LAB_0010877c:
      logmsg(pcVar4,ipaddr);
      goto LAB_00108786;
    }
    __len = 0x1c;
  }
  else {
    if (socket_domain != FLAGS_SHOWSIGN) {
      if (got_exit_signal == 0) goto LAB_0010874c;
      goto LAB_00108786;
    }
    uStack_94 = uStack_94 & 0xffffffff00000000;
    local_9c[0] = '\0';
    local_9c[1] = '\0';
    local_9c[2] = '\0';
    local_9c[3] = '\0';
    local_9c[4] = '\0';
    local_9c[5] = '\0';
    local_9c[6] = '\0';
    local_9c[7] = '\0';
    flag = CONCAT22(port << 8 | port >> 8,2);
    iVar2 = inet_pton(2,ipaddr,local_9c);
    if (iVar2 < 1) {
      pcVar4 = "Error inet_pton failed AF_INET conversion of \'%s\'";
      goto LAB_0010877c;
    }
    __len = 0x10;
  }
  iVar2 = connect(__fd,(sockaddr *)&flag,__len);
  if (got_exit_signal == 0) {
    if (iVar2 == 0) {
LAB_0010874c:
      logmsg("connected fine to %s%s%s:%hu, now tunnel",pcVar4,ipaddr,pcVar5,(ulong)(uint)port);
      return __fd;
    }
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    pcVar4 = strerror(uVar1);
    logmsg("Error connecting to server port %hu: (%d) %s",(ulong)(uint)port,(ulong)uVar1,pcVar4);
  }
LAB_00108786:
  close(__fd);
  return -1;
}

Assistant:

static curl_socket_t connect_to(const char *ipaddr, unsigned short port)
{
  srvr_sockaddr_union_t serveraddr;
  curl_socket_t serverfd;
  int error;
  int rc = 0;
  const char *op_br = "";
  const char *cl_br = "";

#ifdef ENABLE_IPV6
  if(socket_domain == AF_INET6) {
    op_br = "[";
    cl_br = "]";
  }
#endif

  if(!ipaddr)
    return CURL_SOCKET_BAD;

  logmsg("about to connect to %s%s%s:%hu",
         op_br, ipaddr, cl_br, port);


  serverfd = socket(socket_domain, SOCK_STREAM, 0);
  if(CURL_SOCKET_BAD == serverfd) {
    error = SOCKERRNO;
    logmsg("Error creating socket for server connection: (%d) %s",
           error, strerror(error));
    return CURL_SOCKET_BAD;
  }

#ifdef TCP_NODELAY
  if(socket_domain_is_ip()) {
    /* Disable the Nagle algorithm */
    curl_socklen_t flag = 1;
    if(0 != setsockopt(serverfd, IPPROTO_TCP, TCP_NODELAY,
                       (void *)&flag, sizeof(flag)))
      logmsg("====> TCP_NODELAY for server connection failed");
  }
#endif

  switch(socket_domain) {
  case AF_INET:
    memset(&serveraddr.sa4, 0, sizeof(serveraddr.sa4));
    serveraddr.sa4.sin_family = AF_INET;
    serveraddr.sa4.sin_port = htons(port);
    if(Curl_inet_pton(AF_INET, ipaddr, &serveraddr.sa4.sin_addr) < 1) {
      logmsg("Error inet_pton failed AF_INET conversion of '%s'", ipaddr);
      sclose(serverfd);
      return CURL_SOCKET_BAD;
    }

    rc = connect(serverfd, &serveraddr.sa, sizeof(serveraddr.sa4));
    break;
#ifdef ENABLE_IPV6
  case AF_INET6:
    memset(&serveraddr.sa6, 0, sizeof(serveraddr.sa6));
    serveraddr.sa6.sin6_family = AF_INET6;
    serveraddr.sa6.sin6_port = htons(port);
    if(Curl_inet_pton(AF_INET6, ipaddr, &serveraddr.sa6.sin6_addr) < 1) {
      logmsg("Error inet_pton failed AF_INET6 conversion of '%s'", ipaddr);
      sclose(serverfd);
      return CURL_SOCKET_BAD;
    }

    rc = connect(serverfd, &serveraddr.sa, sizeof(serveraddr.sa6));
    break;
#endif /* ENABLE_IPV6 */
#ifdef USE_UNIX_SOCKETS
  case AF_UNIX:
    logmsg("Proxying through Unix socket is not (yet?) supported.");
    return CURL_SOCKET_BAD;
#endif /* USE_UNIX_SOCKETS */
  }

  if(got_exit_signal) {
    sclose(serverfd);
    return CURL_SOCKET_BAD;
  }

  if(rc) {
    error = SOCKERRNO;
    logmsg("Error connecting to server port %hu: (%d) %s",
           port, error, strerror(error));
    sclose(serverfd);
    return CURL_SOCKET_BAD;
  }

  logmsg("connected fine to %s%s%s:%hu, now tunnel",
         op_br, ipaddr, cl_br, port);

  return serverfd;
}